

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.hpp
# Opt level: O1

void __thiscall toml::spec::spec(spec *this,semantic_version *semver)

{
  uint32_t uVar1;
  bool bVar2;
  
  (this->version).patch = semver->patch;
  uVar1 = semver->minor;
  (this->version).major = semver->major;
  (this->version).minor = uVar1;
  uVar1 = semver->major;
  if (uVar1 == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (uVar1 == 1) {
      bVar2 = semver->minor != 0;
    }
  }
  this->v1_1_0_allow_control_characters_in_comments = bVar2;
  if (uVar1 == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (uVar1 == 1) {
      bVar2 = semver->minor != 0;
    }
  }
  this->v1_1_0_allow_newlines_in_inline_tables = bVar2;
  if (uVar1 == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (uVar1 == 1) {
      bVar2 = semver->minor != 0;
    }
  }
  this->v1_1_0_allow_trailing_comma_in_inline_tables = bVar2;
  if (uVar1 == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (uVar1 == 1) {
      bVar2 = semver->minor != 0;
    }
  }
  this->v1_1_0_allow_non_english_in_bare_keys = bVar2;
  if (uVar1 == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (uVar1 == 1) {
      bVar2 = semver->minor != 0;
    }
  }
  this->v1_1_0_add_escape_sequence_e = bVar2;
  if (uVar1 == 0) {
    this->v1_1_0_add_escape_sequence_x = false;
    bVar2 = false;
  }
  else {
    this->v1_1_0_add_escape_sequence_x = semver->minor != 0 || uVar1 != 1;
    bVar2 = true;
    if (uVar1 == 1) {
      bVar2 = semver->minor != 0;
    }
  }
  this->v1_1_0_make_seconds_optional = bVar2;
  this->ext_hex_float = false;
  this->ext_num_suffix = false;
  this->ext_null_value = false;
  return;
}

Assistant:

constexpr explicit spec(const semantic_version& semver) noexcept
        : version{semver},
          v1_1_0_allow_control_characters_in_comments {semantic_version{1, 1, 0} <= semver},
          v1_1_0_allow_newlines_in_inline_tables      {semantic_version{1, 1, 0} <= semver},
          v1_1_0_allow_trailing_comma_in_inline_tables{semantic_version{1, 1, 0} <= semver},
          v1_1_0_allow_non_english_in_bare_keys       {semantic_version{1, 1, 0} <= semver},
          v1_1_0_add_escape_sequence_e                {semantic_version{1, 1, 0} <= semver},
          v1_1_0_add_escape_sequence_x                {semantic_version{1, 1, 0} <= semver},
          v1_1_0_make_seconds_optional                {semantic_version{1, 1, 0} <= semver},
          ext_hex_float {false},
          ext_num_suffix{false},
          ext_null_value{false}
    {}